

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O1

void __thiscall
adios2::EVPathRemote::Open
          (EVPathRemote *this,string *hostname,int32_t port,string *filename,Mode mode,
          bool RowMajorOrdering)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  CMConnection p_Var7;
  int *piVar8;
  timespec local_58;
  ulong local_48;
  string *local_38;
  
  local_38 = filename;
  InitCMData(this);
  uVar5 = create_attr_list();
  uVar1 = attr_atom_from_string("IP_HOST");
  uVar2 = attr_atom_from_string("IP_PORT");
  pcVar6 = strdup((hostname->_M_dataplus)._M_p);
  add_attr(uVar5,uVar1,3,pcVar6);
  add_attr(uVar5,uVar2,1,(long)port);
  p_Var7 = (CMConnection)CMinitiate_conn((this->ev_state).cm,uVar5);
  this->m_conn = p_Var7;
  if ((p_Var7 == (CMConnection)0x0) &&
     ((pcVar6 = getenv("DoRemote"), pcVar6 != (char *)0x0 ||
      (pcVar6 = getenv("DoFileRemote"), pcVar6 != (char *)0x0)))) {
    local_58.tv_sec = 1;
    local_58.tv_nsec = 0;
    do {
      iVar3 = nanosleep(&local_58,&local_58);
      if (iVar3 != -1) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    p_Var7 = (CMConnection)CMinitiate_conn((this->ev_state).cm,uVar5);
    this->m_conn = p_Var7;
  }
  free_attr_list(uVar5);
  if (this->m_conn == (CMConnection)0x0) {
    return;
  }
  local_58.tv_sec = 0;
  local_48 = 0;
  local_58.tv_nsec = (long)(local_38->_M_dataplus)._M_p;
  if (mode == Read) {
    uVar4 = 0;
  }
  else {
    if (mode != ReadRandomAccess) goto LAB_0065e2c1;
    uVar4 = 1;
  }
  local_48 = (ulong)uVar4;
LAB_0065e2c1:
  uVar1 = CMCondition_get((this->ev_state).cm);
  local_58.tv_sec = CONCAT44(local_58.tv_sec._4_4_,uVar1);
  local_48 = (ulong)CONCAT14(RowMajorOrdering,(undefined4)local_48);
  CMCondition_set_client_data((this->ev_state).cm,uVar1,this);
  CMwrite(this->m_conn,(this->ev_state).OpenFileFormat,&local_58);
  CMCondition_wait((this->ev_state).cm,local_58.tv_sec & 0xffffffff);
  this->m_Active = true;
  return;
}

Assistant:

void EVPathRemote::Open(const std::string hostname, const int32_t port, const std::string filename,
                        const Mode mode, bool RowMajorOrdering)
{

    EVPathRemoteCommon::_OpenFileMsg open_msg;
    InitCMData();
    attr_list contact_list = create_attr_list();
    atom_t CM_IP_PORT = -1;
    atom_t CM_IP_HOSTNAME = -1;
    CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    add_attr(contact_list, CM_IP_HOSTNAME, Attr_String, (attr_value)strdup(hostname.c_str()));
    add_attr(contact_list, CM_IP_PORT, Attr_Int4, (attr_value)port);
    m_conn = CMinitiate_conn(ev_state.cm, contact_list);
    if ((m_conn == NULL) && (getenv("DoRemote") || getenv("DoFileRemote")))
    {
        // if we didn't find a server, but we're in testing, wait briefly and try again
        std::this_thread::sleep_for(std::chrono::milliseconds(1000));
        m_conn = CMinitiate_conn(ev_state.cm, contact_list);
    }
    free_attr_list(contact_list);
    if (!m_conn)
        return;

    memset(&open_msg, 0, sizeof(open_msg));
    open_msg.FileName = (char *)filename.c_str();
    switch (mode)
    {
    case Mode::Read:
        open_msg.Mode = EVPathRemoteCommon::RemoteFileMode::RemoteOpen;
        break;
    case Mode::ReadRandomAccess:
        open_msg.Mode = EVPathRemoteCommon::RemoteFileMode::RemoteOpenRandomAccess;
        break;
    default:
        break;
    }
    open_msg.OpenResponseCondition = CMCondition_get(ev_state.cm, m_conn);
    open_msg.RowMajorOrder = RowMajorOrdering;
    CMCondition_set_client_data(ev_state.cm, open_msg.OpenResponseCondition, (void *)this);
    CMwrite(m_conn, ev_state.OpenFileFormat, &open_msg);
    CMCondition_wait(ev_state.cm, open_msg.OpenResponseCondition);
    m_Active = true;
}